

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

bool __thiscall
Lib::DArray<Indexing::CodeTree::LitInfo>::ensure(DArray<Indexing::CodeTree::LitInfo> *this,size_t s)

{
  unsigned_long *puVar1;
  void *placement;
  LitInfo *pLVar2;
  ulong in_RSI;
  ulong *in_RDI;
  LitInfo *newArray;
  void *mem;
  size_t newCapacity;
  size_t in_stack_ffffffffffffffc8;
  unsigned_long local_28;
  unsigned_long local_20;
  ulong local_18 [2];
  bool local_1;
  
  if (in_RDI[1] < in_RSI) {
    local_28 = in_RDI[1] << 1;
    local_18[0] = in_RSI;
    puVar1 = std::max<unsigned_long>(local_18,&local_28);
    local_20 = *puVar1;
    placement = Lib::alloc((size_t)in_RDI);
    pLVar2 = array_new<Indexing::CodeTree::LitInfo>(placement,in_stack_ffffffffffffffc8);
    if (in_RDI[2] != 0) {
      array_delete<Indexing::CodeTree::LitInfo>((LitInfo *)in_RDI[2],in_RDI[1]);
      Lib::free((void *)in_RDI[2]);
    }
    *in_RDI = local_18[0];
    in_RDI[1] = local_20;
    in_RDI[2] = (ulong)pLVar2;
    local_1 = false;
  }
  else {
    *in_RDI = in_RSI;
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }